

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int pragmaVtabOpen(sqlite3_vtab *pVtab,sqlite3_vtab_cursor **ppCursor)

{
  undefined8 *__s;
  undefined8 *in_RSI;
  undefined8 in_RDI;
  PragmaVtabCursor *pCsr;
  int in_stack_ffffffffffffffdc;
  undefined4 local_4;
  
  __s = (undefined8 *)sqlite3_malloc(in_stack_ffffffffffffffdc);
  if (__s == (undefined8 *)0x0) {
    local_4 = 7;
  }
  else {
    memset(__s,0,0x28);
    *__s = in_RDI;
    *in_RSI = __s;
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int pragmaVtabOpen(sqlite3_vtab *pVtab, sqlite3_vtab_cursor **ppCursor){
  PragmaVtabCursor *pCsr;
  pCsr = (PragmaVtabCursor*)sqlite3_malloc(sizeof(*pCsr));
  if( pCsr==0 ) return SQLITE_NOMEM;
  memset(pCsr, 0, sizeof(PragmaVtabCursor));
  pCsr->base.pVtab = pVtab;
  *ppCursor = &pCsr->base;
  return SQLITE_OK;
}